

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O1

vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_> *
vkt::wsi::anon_unknown_0::generateSwapchainParameterCases
          (vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
           *__return_storage_ptr__,Type wsiType,TestDimension dimension,InstanceInterface *vki,
          VkPhysicalDevice physicalDevice,VkSurfaceKHR surface)

{
  iterator iVar1;
  pointer pVVar2;
  VkExtent2D VVar3;
  VkExtent2D VVar4;
  undefined4 uVar5;
  PlatformProperties *pPVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  VkCompositeAlphaFlagBitsKHR VVar12;
  VkSurfaceTransformFlagBitsKHR VVar13;
  VkSwapchainCreateInfoKHR *pVVar14;
  iterator iVar15;
  int ndx;
  deUint32 dVar16;
  pointer pVVar17;
  deUint32 imageCount;
  deUint32 dVar18;
  pointer pVVar19;
  bool bVar20;
  byte bVar21;
  VkSurfaceCapabilitiesKHR capabilities;
  vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> presentModes;
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> formats;
  VkSurfaceCapabilitiesKHR local_fc;
  VkSwapchainCreateInfoKHR local_c8;
  vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> local_60;
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> local_48;
  
  bVar21 = 0;
  ::vk::wsi::getPhysicalDeviceSurfaceCapabilities(&local_fc,vki,physicalDevice,surface);
  ::vk::wsi::getPhysicalDeviceSurfaceFormats(&local_48,vki,physicalDevice,surface);
  ::vk::wsi::getPhysicalDeviceSurfacePresentModes(&local_60,vki,physicalDevice,surface);
  pPVar6 = ::vk::wsi::getPlatformProperties(wsiType);
  (__return_storage_ptr__->
  super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.preTransform = VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
  if ((local_fc.supportedTransforms & VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR) == 0) {
    local_c8.preTransform = local_fc.currentTransform;
  }
  local_c8.sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
  local_c8.pNext = (void *)0x0;
  local_c8.flags = 0;
  local_c8.surface.m_internal = 0;
  local_c8.minImageCount = local_fc.minImageCount;
  local_c8.imageFormat =
       (local_48.super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
        ._M_impl.super__Vector_impl_data._M_start)->format;
  local_c8.imageColorSpace =
       (local_48.super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
        ._M_impl.super__Vector_impl_data._M_start)->colorSpace;
  local_c8.imageExtent =
       (&local_fc.currentExtent)[pPVar6->swapchainExtent == SWAPCHAIN_EXTENT_SETS_WINDOW_SIZE];
  local_c8.imageArrayLayers = 1;
  local_c8.imageUsage = 0x10;
  local_c8.imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_c8.queueFamilyIndexCount = 0;
  local_c8.pQueueFamilyIndices = (deUint32 *)0x0;
  local_c8.compositeAlpha = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
  local_c8.presentMode = VK_PRESENT_MODE_FIFO_KHR;
  local_c8.clipped = 0;
  local_c8.oldSwapchain.m_internal = 0;
  switch(dimension) {
  case TEST_DIMENSION_MIN_IMAGE_COUNT:
    uVar11 = local_fc.minImageCount + 0x10;
    if (local_fc.maxImageCount != 0) {
      uVar11 = local_fc.maxImageCount;
    }
    uVar10 = 0x10;
    if (uVar11 < 0x10) {
      uVar10 = uVar11;
    }
    if (0x10 < local_fc.minImageCount) {
      uVar10 = local_fc.minImageCount;
    }
    if (local_fc.minImageCount <= uVar10) {
      dVar18 = local_fc.minImageCount;
      do {
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
          _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                    ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                      *)__return_storage_ptr__,iVar1,&local_c8);
        }
        else {
          pVVar14 = &local_c8;
          iVar15._M_current = iVar1._M_current;
          for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
            uVar5 = *(undefined4 *)&pVVar14->field_0x4;
            (iVar15._M_current)->sType = pVVar14->sType;
            *(undefined4 *)&(iVar15._M_current)->field_0x4 = uVar5;
            pVVar14 = (VkSwapchainCreateInfoKHR *)((long)pVVar14 + (ulong)bVar21 * -0x10 + 8);
            iVar15._M_current = iVar15._M_current + (ulong)bVar21 * -0x10 + 8;
          }
          (__return_storage_ptr__->
          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        (__return_storage_ptr__->
        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
        )._M_impl.super__Vector_impl_data._M_finish[-1].minImageCount = dVar18;
        dVar18 = dVar18 + 1;
      } while (dVar18 <= uVar10);
    }
    break;
  case TEST_DIMENSION_IMAGE_FORMAT:
    if (local_48.super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pVVar17 = local_48.
                super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
          _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                    ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                      *)__return_storage_ptr__,iVar1,&local_c8);
        }
        else {
          pVVar14 = &local_c8;
          iVar15._M_current = iVar1._M_current;
          for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
            uVar5 = *(undefined4 *)&pVVar14->field_0x4;
            (iVar15._M_current)->sType = pVVar14->sType;
            *(undefined4 *)&(iVar15._M_current)->field_0x4 = uVar5;
            pVVar14 = (VkSwapchainCreateInfoKHR *)((long)pVVar14 + (ulong)bVar21 * -0x10 + 8);
            iVar15._M_current = iVar15._M_current + (ulong)bVar21 * -0x10 + 8;
          }
          (__return_storage_ptr__->
          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        pVVar2 = (__return_storage_ptr__->
                 super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pVVar2[-1].imageFormat = pVVar17->format;
        pVVar2[-1].imageColorSpace = pVVar17->colorSpace;
        pVVar17 = pVVar17 + 1;
      } while (pVVar17 !=
               local_48.
               super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    break;
  case TEST_DIMENSION_IMAGE_EXTENT:
    if (pPVar6->swapchainExtent - SWAPCHAIN_EXTENT_SETS_WINDOW_SIZE < 2) {
      lVar8 = 0;
      do {
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
          _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                    ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                      *)__return_storage_ptr__,iVar1,&local_c8);
        }
        else {
          pVVar14 = &local_c8;
          iVar15._M_current = iVar1._M_current;
          for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
            uVar5 = *(undefined4 *)&pVVar14->field_0x4;
            (iVar15._M_current)->sType = pVVar14->sType;
            *(undefined4 *)&(iVar15._M_current)->field_0x4 = uVar5;
            pVVar14 = (VkSwapchainCreateInfoKHR *)((long)pVVar14 + (ulong)bVar21 * -0x10 + 8);
            iVar15._M_current = iVar15._M_current + (ulong)bVar21 * -0x10 + 8;
          }
          (__return_storage_ptr__->
          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        uVar11 = (&wsi::(anonymous_namespace)::
                   generateSwapchainParameterCases(vk::wsi::Type,vkt::wsi::(anonymous_namespace)::TestDimension,vk::VkSurfaceCapabilitiesKHR_const&,std::vector<vk::VkSurfaceFormatKHR,std::allocator<vk::VkSurfaceFormatKHR>>const&,std::vector<vk::VkPresentModeKHR,std::allocator<vk::VkPresentModeKHR>>const&)
                   ::s_testSizes)[lVar8 * 2];
        uVar10 = (&DAT_00b68f74)[lVar8 * 2];
        uVar7 = local_fc.maxImageExtent.width;
        if (uVar11 < local_fc.maxImageExtent.width) {
          uVar7 = uVar11;
        }
        if (uVar11 < local_fc.minImageExtent.width) {
          uVar7 = local_fc.minImageExtent.width;
        }
        pVVar2 = (__return_storage_ptr__->
                 super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pVVar2[-1].imageExtent.width = uVar7;
        uVar11 = local_fc.maxImageExtent.height;
        if (uVar10 < local_fc.maxImageExtent.height) {
          uVar11 = uVar10;
        }
        if (uVar10 < local_fc.minImageExtent.height) {
          uVar11 = local_fc.minImageExtent.height;
        }
        pVVar2[-1].imageExtent.height = uVar11;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 5);
    }
    if (pPVar6->swapchainExtent != SWAPCHAIN_EXTENT_SETS_WINDOW_SIZE) {
      iVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
        _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                  ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                    *)__return_storage_ptr__,iVar1,&local_c8);
      }
      else {
        pVVar14 = &local_c8;
        iVar15._M_current = iVar1._M_current;
        for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
          uVar5 = *(undefined4 *)&pVVar14->field_0x4;
          (iVar15._M_current)->sType = pVVar14->sType;
          *(undefined4 *)&(iVar15._M_current)->field_0x4 = uVar5;
          pVVar14 = (VkSwapchainCreateInfoKHR *)((long)pVVar14 + ((ulong)bVar21 * -2 + 1) * 8);
          iVar15._M_current = iVar15._M_current + (ulong)bVar21 * -0x10 + 8;
        }
        (__return_storage_ptr__->
        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
        )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      (__return_storage_ptr__->
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      )._M_impl.super__Vector_impl_data._M_finish[-1].imageExtent = local_fc.currentExtent;
    }
    if (pPVar6->swapchainExtent != SWAPCHAIN_EXTENT_MUST_MATCH_WINDOW_SIZE) {
      iVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
        _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                  ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                    *)__return_storage_ptr__,iVar1,&local_c8);
      }
      else {
        pVVar14 = &local_c8;
        iVar15._M_current = iVar1._M_current;
        for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
          uVar5 = *(undefined4 *)&pVVar14->field_0x4;
          (iVar15._M_current)->sType = pVVar14->sType;
          *(undefined4 *)&(iVar15._M_current)->field_0x4 = uVar5;
          pVVar14 = (VkSwapchainCreateInfoKHR *)((long)pVVar14 + ((ulong)bVar21 * -2 + 1) * 8);
          iVar15._M_current = iVar15._M_current + (ulong)bVar21 * -0x10 + 8;
        }
        (__return_storage_ptr__->
        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
        )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      VVar3.height = local_fc.minImageExtent.height;
      VVar3.width = local_fc.minImageExtent.width;
      (__return_storage_ptr__->
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      )._M_impl.super__Vector_impl_data._M_finish[-1].imageExtent = VVar3;
      iVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
        _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                  ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                    *)__return_storage_ptr__,iVar1,&local_c8);
      }
      else {
        pVVar14 = &local_c8;
        iVar15._M_current = iVar1._M_current;
        for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
          uVar5 = *(undefined4 *)&pVVar14->field_0x4;
          (iVar15._M_current)->sType = pVVar14->sType;
          *(undefined4 *)&(iVar15._M_current)->field_0x4 = uVar5;
          pVVar14 = (VkSwapchainCreateInfoKHR *)((long)pVVar14 + ((ulong)bVar21 * -2 + 1) * 8);
          iVar15._M_current = iVar15._M_current + (ulong)bVar21 * -0x10 + 8;
        }
        (__return_storage_ptr__->
        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
        )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      VVar4.height = local_fc.maxImageExtent.height;
      VVar4.width = local_fc.maxImageExtent.width;
      (__return_storage_ptr__->
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      )._M_impl.super__Vector_impl_data._M_finish[-1].imageExtent = VVar4;
    }
    break;
  case TEST_DIMENSION_IMAGE_ARRAY_LAYERS:
    if (local_fc.maxImageArrayLayers != 0) {
      dVar18 = 0x10;
      if (local_fc.maxImageArrayLayers < 0x10) {
        dVar18 = local_fc.maxImageArrayLayers;
      }
      dVar16 = 1;
      do {
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
          _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                    ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                      *)__return_storage_ptr__,iVar1,&local_c8);
        }
        else {
          pVVar14 = &local_c8;
          iVar15._M_current = iVar1._M_current;
          for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
            uVar5 = *(undefined4 *)&pVVar14->field_0x4;
            (iVar15._M_current)->sType = pVVar14->sType;
            *(undefined4 *)&(iVar15._M_current)->field_0x4 = uVar5;
            pVVar14 = (VkSwapchainCreateInfoKHR *)((long)pVVar14 + (ulong)bVar21 * -0x10 + 8);
            iVar15._M_current = iVar15._M_current + (ulong)bVar21 * -0x10 + 8;
          }
          (__return_storage_ptr__->
          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        (__return_storage_ptr__->
        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
        )._M_impl.super__Vector_impl_data._M_finish[-1].imageArrayLayers = dVar16;
        bVar20 = dVar16 != dVar18;
        dVar16 = dVar16 + 1;
      } while (bVar20);
    }
    break;
  case TEST_DIMENSION_IMAGE_USAGE:
    if (local_fc.supportedUsageFlags != 0) {
      uVar11 = 1;
      do {
        if ((uVar11 & ~local_fc.supportedUsageFlags) == 0) {
          iVar1._M_current =
               (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
            _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                      ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                        *)__return_storage_ptr__,iVar1,&local_c8);
          }
          else {
            pVVar14 = &local_c8;
            iVar15._M_current = iVar1._M_current;
            for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
              uVar5 = *(undefined4 *)&pVVar14->field_0x4;
              (iVar15._M_current)->sType = pVVar14->sType;
              *(undefined4 *)&(iVar15._M_current)->field_0x4 = uVar5;
              pVVar14 = (VkSwapchainCreateInfoKHR *)((long)pVVar14 + (ulong)bVar21 * -0x10 + 8);
              iVar15._M_current = iVar15._M_current + (ulong)bVar21 * -0x10 + 8;
            }
            (__return_storage_ptr__->
            super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          (__return_storage_ptr__->
          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
          )._M_impl.super__Vector_impl_data._M_finish[-1].imageUsage = uVar11;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 <= local_fc.supportedUsageFlags);
    }
    break;
  case TEST_DIMENSION_IMAGE_SHARING_MODE:
    iVar1._M_current =
         (__return_storage_ptr__->
         super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
      _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                  *)__return_storage_ptr__,iVar1,&local_c8);
    }
    else {
      pVVar14 = &local_c8;
      iVar15._M_current = iVar1._M_current;
      for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
        uVar5 = *(undefined4 *)&pVVar14->field_0x4;
        (iVar15._M_current)->sType = pVVar14->sType;
        *(undefined4 *)&(iVar15._M_current)->field_0x4 = uVar5;
        pVVar14 = (VkSwapchainCreateInfoKHR *)((long)pVVar14 + ((ulong)bVar21 * -2 + 1) * 8);
        iVar15._M_current = iVar15._M_current + (ulong)bVar21 * -0x10 + 8;
      }
      (__return_storage_ptr__->
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    iVar1._M_current =
         (__return_storage_ptr__->
         super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    iVar1._M_current[-1].imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
    if (iVar1._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
      _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                  *)__return_storage_ptr__,iVar1,&local_c8);
    }
    else {
      pVVar14 = &local_c8;
      iVar15._M_current = iVar1._M_current;
      for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
        uVar5 = *(undefined4 *)&pVVar14->field_0x4;
        (iVar15._M_current)->sType = pVVar14->sType;
        *(undefined4 *)&(iVar15._M_current)->field_0x4 = uVar5;
        pVVar14 = (VkSwapchainCreateInfoKHR *)((long)pVVar14 + ((ulong)bVar21 * -2 + 1) * 8);
        iVar15._M_current = iVar15._M_current + (ulong)bVar21 * -0x10 + 8;
      }
      (__return_storage_ptr__->
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    (__return_storage_ptr__->
    super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>)
    ._M_impl.super__Vector_impl_data._M_finish[-1].imageSharingMode = VK_SHARING_MODE_CONCURRENT;
    break;
  case TEST_DIMENSION_PRE_TRANSFORM:
    if (local_fc.supportedTransforms != 0) {
      VVar13 = VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
      do {
        if ((VVar13 & local_fc.supportedTransforms) != 0) {
          iVar1._M_current =
               (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
            _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                      ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                        *)__return_storage_ptr__,iVar1,&local_c8);
          }
          else {
            pVVar14 = &local_c8;
            iVar15._M_current = iVar1._M_current;
            for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
              uVar5 = *(undefined4 *)&pVVar14->field_0x4;
              (iVar15._M_current)->sType = pVVar14->sType;
              *(undefined4 *)&(iVar15._M_current)->field_0x4 = uVar5;
              pVVar14 = (VkSwapchainCreateInfoKHR *)((long)pVVar14 + (ulong)bVar21 * -0x10 + 8);
              iVar15._M_current = iVar15._M_current + (ulong)bVar21 * -0x10 + 8;
            }
            (__return_storage_ptr__->
            super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          (__return_storage_ptr__->
          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
          )._M_impl.super__Vector_impl_data._M_finish[-1].preTransform = VVar13;
        }
        VVar13 = VVar13 * 2;
      } while (VVar13 <= local_fc.supportedTransforms);
    }
    break;
  case TEST_DIMENSION_COMPOSITE_ALPHA:
    if (local_fc.supportedCompositeAlpha != 0) {
      VVar12 = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
      do {
        if ((VVar12 & local_fc.supportedCompositeAlpha) != 0) {
          iVar1._M_current =
               (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
            _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                      ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                        *)__return_storage_ptr__,iVar1,&local_c8);
          }
          else {
            pVVar14 = &local_c8;
            iVar15._M_current = iVar1._M_current;
            for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
              uVar5 = *(undefined4 *)&pVVar14->field_0x4;
              (iVar15._M_current)->sType = pVVar14->sType;
              *(undefined4 *)&(iVar15._M_current)->field_0x4 = uVar5;
              pVVar14 = (VkSwapchainCreateInfoKHR *)((long)pVVar14 + (ulong)bVar21 * -0x10 + 8);
              iVar15._M_current = iVar15._M_current + (ulong)bVar21 * -0x10 + 8;
            }
            (__return_storage_ptr__->
            super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          (__return_storage_ptr__->
          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
          )._M_impl.super__Vector_impl_data._M_finish[-1].compositeAlpha = VVar12;
        }
        VVar12 = VVar12 * 2;
      } while (VVar12 <= local_fc.supportedCompositeAlpha);
    }
    break;
  case TEST_DIMENSION_PRESENT_MODE:
    if (local_60.super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_60.super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pVVar19 = local_60.
                super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
          _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                    ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                      *)__return_storage_ptr__,iVar1,&local_c8);
        }
        else {
          pVVar14 = &local_c8;
          iVar15._M_current = iVar1._M_current;
          for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
            uVar5 = *(undefined4 *)&pVVar14->field_0x4;
            (iVar15._M_current)->sType = pVVar14->sType;
            *(undefined4 *)&(iVar15._M_current)->field_0x4 = uVar5;
            pVVar14 = (VkSwapchainCreateInfoKHR *)((long)pVVar14 + (ulong)bVar21 * -0x10 + 8);
            iVar15._M_current = iVar15._M_current + (ulong)bVar21 * -0x10 + 8;
          }
          (__return_storage_ptr__->
          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        (__return_storage_ptr__->
        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
        )._M_impl.super__Vector_impl_data._M_finish[-1].presentMode = *pVVar19;
        pVVar19 = pVVar19 + 1;
      } while (pVVar19 !=
               local_60.
               super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    break;
  case TEST_DIMENSION_CLIPPED:
    iVar1._M_current =
         (__return_storage_ptr__->
         super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
      _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                  *)__return_storage_ptr__,iVar1,&local_c8);
    }
    else {
      pVVar14 = &local_c8;
      iVar15._M_current = iVar1._M_current;
      for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
        uVar5 = *(undefined4 *)&pVVar14->field_0x4;
        (iVar15._M_current)->sType = pVVar14->sType;
        *(undefined4 *)&(iVar15._M_current)->field_0x4 = uVar5;
        pVVar14 = (VkSwapchainCreateInfoKHR *)((long)pVVar14 + ((ulong)bVar21 * -2 + 1) * 8);
        iVar15._M_current = iVar15._M_current + (ulong)bVar21 * -0x10 + 8;
      }
      (__return_storage_ptr__->
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    iVar1._M_current =
         (__return_storage_ptr__->
         super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    iVar1._M_current[-1].clipped = 0;
    if (iVar1._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
      _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                  *)__return_storage_ptr__,iVar1,&local_c8);
    }
    else {
      pVVar14 = &local_c8;
      iVar15._M_current = iVar1._M_current;
      for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
        uVar5 = *(undefined4 *)&pVVar14->field_0x4;
        (iVar15._M_current)->sType = pVVar14->sType;
        *(undefined4 *)&(iVar15._M_current)->field_0x4 = uVar5;
        pVVar14 = (VkSwapchainCreateInfoKHR *)((long)pVVar14 + ((ulong)bVar21 * -2 + 1) * 8);
        iVar15._M_current = iVar15._M_current + (ulong)bVar21 * -0x10 + 8;
      }
      (__return_storage_ptr__->
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    (__return_storage_ptr__->
    super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>)
    ._M_impl.super__Vector_impl_data._M_finish[-1].clipped = 1;
  }
  if (local_60.super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>.
      _M_impl.super__Vector_impl_data._M_start != (VkPresentModeKHR *)0x0) {
    operator_delete(local_60.
                    super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<VkSwapchainCreateInfoKHR> generateSwapchainParameterCases (Type								wsiType,
																  TestDimension						dimension,
																  const InstanceInterface&			vki,
																  VkPhysicalDevice					physicalDevice,
																  VkSurfaceKHR						surface)
{
	const VkSurfaceCapabilitiesKHR		capabilities	= getPhysicalDeviceSurfaceCapabilities(vki,
																							   physicalDevice,
																							   surface);
	const vector<VkSurfaceFormatKHR>	formats			= getPhysicalDeviceSurfaceFormats(vki,
																						  physicalDevice,
																						  surface);
	const vector<VkPresentModeKHR>		presentModes	= getPhysicalDeviceSurfacePresentModes(vki,
																							   physicalDevice,
																							   surface);

	return generateSwapchainParameterCases(wsiType, dimension, capabilities, formats, presentModes);
}